

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_pk8.cc
# Opt level: O1

int do_pk8pkey_fp(FILE *fp,EVP_PKEY *x,int isder,int nid,EVP_CIPHER *enc,char *pass,int pass_len,
                 pem_password_cb *cb,void *u)

{
  int iVar1;
  BIO *a;
  
  a = BIO_new_fp((FILE *)fp,0);
  if (a == (BIO *)0x0) {
    ERR_put_error(9,0,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pk8.cc"
                  ,0xb6);
    iVar1 = 0;
  }
  else {
    iVar1 = do_pk8pkey((BIO *)a,x,isder,nid,enc,pass,pass_len,cb,u);
    BIO_free(a);
  }
  return iVar1;
}

Assistant:

static int do_pk8pkey_fp(FILE *fp, const EVP_PKEY *x, int isder, int nid,
                         const EVP_CIPHER *enc, const char *pass, int pass_len,
                         pem_password_cb *cb, void *u) {
  BIO *bp;
  int ret;
  if (!(bp = BIO_new_fp(fp, BIO_NOCLOSE))) {
    OPENSSL_PUT_ERROR(PEM, ERR_R_BUF_LIB);
    return 0;
  }
  ret = do_pk8pkey(bp, x, isder, nid, enc, pass, pass_len, cb, u);
  BIO_free(bp);
  return ret;
}